

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniz.c
# Opt level: O1

int mz_deflateInit2(mz_streamp pStream,int level,int method,int window_bits,int mem_level,
                   int strategy)

{
  mz_uint mVar1;
  tdefl_compressor *d;
  int iVar2;
  
  mVar1 = tdefl_create_comp_flags_from_zip_params(level,window_bits,strategy);
  if (pStream == (mz_streamp)0x0) {
    iVar2 = -2;
  }
  else {
    iVar2 = -10000;
    if ((0xfffffff6 < mem_level - 10U && method == 8) &&
       ((window_bits == 0xf || (window_bits == -0xf)))) {
      pStream->data_type = 0;
      pStream->adler = 1;
      pStream->reserved = 0;
      pStream->total_in = 0;
      pStream->total_out = 0;
      pStream->msg = (char *)0x0;
      if (pStream->zalloc == (mz_alloc_func)0x0) {
        pStream->zalloc = miniz_def_alloc_func;
      }
      if (pStream->zfree == (mz_free_func)0x0) {
        pStream->zfree = miniz_def_free_func;
      }
      d = (tdefl_compressor *)(*pStream->zalloc)(pStream->opaque,1,0x4df78);
      if (d == (tdefl_compressor *)0x0) {
        iVar2 = -4;
      }
      else {
        pStream->state = (mz_internal_state *)d;
        iVar2 = 0;
        tdefl_init(d,(tdefl_put_buf_func_ptr)0x0,(void *)0x0,mVar1 | 0x2000);
      }
    }
  }
  return iVar2;
}

Assistant:

int mz_deflateInit2(mz_streamp pStream, int level, int method, int window_bits, int mem_level, int strategy)
{
    tdefl_compressor *pComp;
    mz_uint comp_flags = TDEFL_COMPUTE_ADLER32 | tdefl_create_comp_flags_from_zip_params(level, window_bits, strategy);

    if (!pStream)
        return MZ_STREAM_ERROR;
    if ((method != MZ_DEFLATED) || ((mem_level < 1) || (mem_level > 9)) || ((window_bits != MZ_DEFAULT_WINDOW_BITS) && (-window_bits != MZ_DEFAULT_WINDOW_BITS)))
        return MZ_PARAM_ERROR;

    pStream->data_type = 0;
    pStream->adler = MZ_ADLER32_INIT;
    pStream->msg = NULL;
    pStream->reserved = 0;
    pStream->total_in = 0;
    pStream->total_out = 0;
    if (!pStream->zalloc)
        pStream->zalloc = miniz_def_alloc_func;
    if (!pStream->zfree)
        pStream->zfree = miniz_def_free_func;

    pComp = (tdefl_compressor *)pStream->zalloc(pStream->opaque, 1, sizeof(tdefl_compressor));
    if (!pComp)
        return MZ_MEM_ERROR;

    pStream->state = (struct mz_internal_state *)pComp;

    if (tdefl_init(pComp, NULL, NULL, comp_flags) != TDEFL_STATUS_OKAY)
    {
        mz_deflateEnd(pStream);
        return MZ_PARAM_ERROR;
    }

    return MZ_OK;
}